

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetReturnDropKeepCount
          (BinaryReaderInterp *this,Index *out_drop_count,Index *out_keep_count)

{
  bool bVar1;
  Result result;
  Index IVar2;
  size_type sVar3;
  Index *out_keep_count_local;
  Index *out_drop_count_local;
  BinaryReaderInterp *this_local;
  
  sVar3 = std::
          vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
          ::size(&this->label_stack_);
  result = GetBrDropKeepCount(this,(int)sVar3 - 1,out_drop_count,out_keep_count);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    IVar2 = SharedValidator::GetLocalCount(&this->validator_);
    *out_drop_count = IVar2 + *out_drop_count;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::GetReturnDropKeepCount(Index* out_drop_count,
                                                  Index* out_keep_count) {
  CHECK_RESULT(GetBrDropKeepCount(label_stack_.size() - 1, out_drop_count,
                                  out_keep_count));
  *out_drop_count += validator_.GetLocalCount();
  return Result::Ok;
}